

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O2

vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> * __thiscall
Pda::findEclosure(vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *__return_storage_ptr__,
                 Pda *this,Node *n)

{
  pointer *pppNVar1;
  char cVar2;
  pointer ppTVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *pvVar7;
  Pda *pPVar8;
  Node *n_00;
  string *newTop;
  _Elt_pointer pcVar9;
  char *pcVar10;
  undefined8 in_RCX;
  undefined8 uVar11;
  pointer ppTVar12;
  pointer ppNVar13;
  Node *next;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> newclosure;
  Pda *local_108;
  uint local_fc;
  _Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> local_f8;
  pointer local_e0;
  Node *local_d8;
  _Deque_base<char,_std::allocator<char>_> local_d0;
  _Deque_base<char,_std::allocator<char>_> local_80;
  
  (__return_storage_ptr__->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = n;
  std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::push_back
            (__return_storage_ptr__,&local_d8);
  uVar11 = CONCAT71((int7)((ulong)in_RCX >> 8),1);
  bVar4 = true;
  while (bVar4) {
    local_fc = (uint)uVar11;
    local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_start = (Node **)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_finish = (Node **)0x0;
    local_e0 = (__return_storage_ptr__->
               super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    bVar4 = false;
    for (ppNVar13 = (__return_storage_ptr__->
                    super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
                    super__Vector_impl_data._M_start; ppNVar13 != local_e0; ppNVar13 = ppNVar13 + 1)
    {
      pvVar7 = Tjen::Node::getTransitions(*ppNVar13);
      ppTVar3 = (pvVar7->
                super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      for (ppTVar12 = (pvVar7->
                      super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                      )._M_impl.super__Vector_impl_data._M_start; ppTVar12 != ppTVar3;
          ppTVar12 = ppTVar12 + 1) {
        cVar5 = Tjen::Node::Transition::getInput(*ppTVar12);
        pPVar8 = (Pda *)operator_new(0x88);
        n_00 = Tjen::Node::Transition::getTo(*ppTVar12);
        Tjen::Node::Node((Node *)pPVar8,n_00);
        local_108 = pPVar8;
        Tjen::Node::getStack
                  ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_80,*ppNVar13);
        Tjen::Node::setStack
                  ((Node *)pPVar8,(stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_80
                  );
        std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_80);
        pPVar8 = local_108;
        if (cVar5 == -0x32) {
          newTop = Tjen::Node::Transition::getNewstack_abi_cxx11_(*ppTVar12);
          Tjen::Node::editStack((Node *)pPVar8,newTop);
          bVar6 = checkIfDouble(pPVar8,__return_storage_ptr__,(Node *)local_108);
          if (!bVar6) {
            Tjen::Node::getStack
                      ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_d0,*ppNVar13)
            ;
            pcVar9 = local_d0._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_d0._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_d0._M_impl.super__Deque_impl_data._M_finish._M_first) {
              pcVar9 = local_d0._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
            }
            cVar5 = pcVar9[-1];
            pcVar10 = Tjen::Node::Transition::getOldStack(*ppTVar12);
            cVar2 = *pcVar10;
            std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_d0);
            if (cVar5 == cVar2) {
              bVar4 = true;
              std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::push_back
                        ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)&local_f8,
                         (value_type *)&local_108);
            }
          }
        }
      }
    }
    if ((local_fc & 1) != 0) {
      pppNVar1 = &(__return_storage_ptr__->
                  super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + -1;
    }
    std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::
    insert<__gnu_cxx::__normal_iterator<Tjen::Node**,std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>>,void>
              ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)__return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->
               super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
                )local_f8._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
                )local_f8._M_impl.super__Vector_impl_data._M_finish);
    std::_Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::~_Vector_base(&local_f8);
    uVar11 = 0;
  }
  std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::push_back
            (__return_storage_ptr__,&local_d8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tjen::Node*> Pda::findEclosure(Tjen::Node *n) {

    std::vector<Tjen::Node *> eclosure; //totaal
    eclosure.push_back(n);

    bool found = true;
    bool first = true;
    while (found) {

        std::vector<Tjen::Node *> newclosure; //gevonden

        found = false;
        for (auto &node: eclosure) {
            for (auto &f: node->getTransitions()) {
                const char in = f->getInput();
                const char *e = "ε";

                Tjen::Node *next = new Tjen::Node(f->getTo());
                next->setStack(node->getStack());
                if (in == *e) {
                    next->editStack(f->getNewstack());

                    if (!checkIfDouble(eclosure, next) && node->getStack().top() == f->getOldStack()) {
                        newclosure.push_back(next);
                        found = true;
                    }

                }

            }
        }
        if (first) {
            eclosure.pop_back();
            first = false;
        }
        eclosure.insert(eclosure.begin(), newclosure.begin(), newclosure.end());
    }
    eclosure.push_back(n);
    return eclosure;
}